

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

void SGParser::Generator::FollowPos
               (RegExprDFANode *node,vector<unsigned_int,_std::allocator<unsigned_int>_> *nodelist)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__y;
  uint *puVar1;
  pointer ppRVar2;
  bool bVar3;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var4
  ;
  RegExprDFANode *pRVar5;
  
  __y = &node->LastPos;
  puVar1 = &node->Position;
  do {
    bVar3 = false;
    do {
      do {
        while( true ) {
          if (bVar3) {
            return;
          }
          do {
            node = node->pParent;
            if (node == (RegExprDFANode *)0x0) {
              return;
            }
            bVar3 = std::operator==(&node->LastPos,__y);
          } while (bVar3);
          if (node->Type != Star) break;
          _Var4 = std::
                  __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                            ((node->LastPos).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,
                             (node->LastPos).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,puVar1);
          bVar3 = true;
          pRVar5 = node;
          if (_Var4._M_current !=
              (node->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_001329b5;
        }
        bVar3 = false;
      } while (node->Type != And);
      pRVar5 = *(node->Children).
                super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                        ((pRVar5->LastPos).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         *(pointer *)
                          ((long)&(pRVar5->LastPos).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + 8),puVar1);
      ppRVar2 = (node->Children).
                super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = true;
    } while (_Var4._M_current ==
             *(pointer *)
              ((long)&((*ppRVar2)->LastPos).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8));
    pRVar5 = ppRVar2[1];
LAB_001329b5:
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)nodelist,
               (const_iterator)
               (nodelist->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(pRVar5->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )(pRVar5->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
  } while( true );
}

Assistant:

void FollowPos(const RegExprDFANode& node, std::vector<unsigned>& nodelist) {
    bool done  = false;
    auto pnode = node.pParent;

    while (pnode && !done) {
        if (pnode->LastPos == node.LastPos) {
            pnode = pnode->pParent;
            continue;
        }

        switch (pnode->Type) {
            case RegExprDFANode::NodeType::And:
                if (std::find(pnode->Children[0u]->LastPos.begin(),
                              pnode->Children[0u]->LastPos.end(), node.Position) !=
                    pnode->Children[0u]->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->Children[1u]->FirstPos.begin(),
                                    pnode->Children[1u]->FirstPos.end());
                else
                    done = true;
                break;

            case RegExprDFANode::NodeType::Star:
                if (std::find(pnode->LastPos.begin(), pnode->LastPos.end(), node.Position) !=
                    pnode->LastPos.end())
                    nodelist.insert(nodelist.end(), pnode->FirstPos.begin(),
                                    pnode->FirstPos.end());
                else
                    done = true;
                break;

            default:
                break;
        }

        pnode = pnode->pParent;
    }
}